

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::extAddPairwise<8,signed_char,short>(Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  Type *this_00;
  int32_t iVar1;
  int32_t iVar2;
  reference pvVar3;
  reference this_01;
  Literal local_288;
  ulong local_270;
  size_t i;
  undefined1 local_258 [8];
  LaneArray<8> result;
  LaneArray<8_*_2> lanes;
  Literal *vec_local;
  
  getLanes<signed_char,16>((LaneArray<16> *)&result._M_elems[7].type,this,vec);
  std::array<wasm::Literal,_8UL>::array((array<wasm::Literal,_8UL> *)local_258);
  for (local_270 = 0; local_270 < 8; local_270 = local_270 + 1) {
    this_00 = &result._M_elems[7].type;
    pvVar3 = std::array<wasm::Literal,_16UL>::operator[]
                       ((array<wasm::Literal,_16UL> *)this_00,local_270 * 2);
    iVar1 = Literal::geti32(pvVar3);
    pvVar3 = std::array<wasm::Literal,_16UL>::operator[]
                       ((array<wasm::Literal,_16UL> *)this_00,local_270 * 2 + 1);
    iVar2 = Literal::geti32(pvVar3);
    Literal::Literal(&local_288,(int)(char)iVar1 + (int)(char)iVar2);
    this_01 = std::array<wasm::Literal,_8UL>::operator[]
                        ((array<wasm::Literal,_8UL> *)local_258,local_270);
    Literal::operator=(this_01,&local_288);
    Literal::~Literal(&local_288);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)local_258);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_258);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)&result._M_elems[7].type);
  return __return_storage_ptr__;
}

Assistant:

static Literal extAddPairwise(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; i++) {
    result[i] = Literal((LaneTo)(LaneFrom)lanes[i * 2 + 0].geti32() +
                        (LaneTo)(LaneFrom)lanes[i * 2 + 1].geti32());
  }
  return Literal(result);
}